

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O2

tensor * Relu(vector<tensor_*,_std::allocator<tensor_*>_> *x)

{
  relu *this;
  tensor *ptVar1;
  _Vector_base<tensor_*,_std::allocator<tensor_*>_> local_30;
  
  this = (relu *)operator_new(0x48);
  (this->super_node)._vptr_node = (_func_int **)0x0;
  (this->super_node).ret = (tensor *)0x0;
  *(undefined8 *)&(this->super_node).isbuild = 0;
  (this->super_node).input.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_node).input.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  node::node_cnt = node::node_cnt + 1;
  (this->super_node).input.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_node).grad_fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_node).grad_fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_node).grad_fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_node)._vptr_node = (_func_int **)&PTR_forward_00109b50;
  std::vector<tensor_*,_std::allocator<tensor_*>_>::vector
            ((vector<tensor_*,_std::allocator<tensor_*>_> *)&local_30,x);
  ptVar1 = relu::forward(this,(vector<tensor_*,_std::allocator<tensor_*>_> *)&local_30);
  std::_Vector_base<tensor_*,_std::allocator<tensor_*>_>::~_Vector_base(&local_30);
  return ptVar1;
}

Assistant:

tensor* Relu(vector<tensor *> x){
    node *op = new relu();
    return op->forward(x);
}